

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_cast.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::MapCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalType varchar_type;
  undefined1 local_80 [24];
  LogicalType local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  if (target->id_ == VARCHAR) {
    LogicalType::LogicalType(&local_50,VARCHAR);
    LogicalType::LogicalType(&local_68,VARCHAR);
    LogicalType::MAP(&local_38,&local_50,&local_68);
    LogicalType::~LogicalType(&local_68);
    LogicalType::~LogicalType(&local_50);
    ListBoundCastData::BindListToListCast((ListBoundCastData *)local_80,input,source,&local_38);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,MapToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_80,ListBoundCastData::InitListLocalState);
    if ((_func_int **)local_80._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_80._0_8_ + 8))();
    }
    local_80._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType(&local_38);
  }
  else if (target->id_ == MAP) {
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)(local_80 + 0x10),input,source,target);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListCast::ListToListCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_80 + 0x10),ListBoundCastData::InitListLocalState);
    if ((init_cast_local_state_t)local_80._16_8_ != (init_cast_local_state_t)0x0) {
      (**(code **)(*(long *)local_80._16_8_ + 8))();
    }
  }
  else {
    local_80._8_8_ = (cast_function_t)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)(local_80 + 8),(init_cast_local_state_t)0x0);
    if ((cast_function_t)local_80._8_8_ != (cast_function_t)0x0) {
      (**(code **)(*(long *)local_80._8_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::MapCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::MAP:
		return BoundCastInfo(ListCast::ListToListCast, ListBoundCastData::BindListToListCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	case LogicalTypeId::VARCHAR: {
		auto varchar_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
		return BoundCastInfo(MapToVarcharCast, ListBoundCastData::BindListToListCast(input, source, varchar_type),
		                     ListBoundCastData::InitListLocalState);
	}
	default:
		return TryVectorNullCast;
	}
}